

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void ConvertRGBToUV_SSE2(__m128i *R,__m128i *G,__m128i *B,__m128i *U,__m128i *V)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*in_RCX) [16];
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  __m128i V0_hi_1;
  __m128i V0_lo_1;
  __m128i V5_hi;
  __m128i V5_lo;
  __m128i V3_hi;
  __m128i V3_lo;
  __m128i V2_hi;
  __m128i V2_lo;
  __m128i V1_hi;
  __m128i V1_lo;
  __m128i V0_hi;
  __m128i V0_lo;
  __m128i GB_hi;
  __m128i GB_lo;
  __m128i RG_hi;
  __m128i RG_lo;
  __m128i kHALF_UV;
  __m128i kGB_v;
  __m128i kRG_v;
  __m128i kGB_u;
  __m128i kRG_u;
  undefined2 local_378;
  undefined2 uStack_376;
  undefined2 uStack_374;
  undefined2 uStack_372;
  undefined2 local_368;
  undefined2 uStack_366;
  undefined2 uStack_364;
  undefined2 uStack_362;
  undefined2 local_358;
  undefined2 uStack_356;
  undefined2 uStack_354;
  undefined2 uStack_352;
  undefined2 local_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 uStack_330;
  undefined2 uStack_32e;
  undefined2 uStack_32c;
  undefined2 uStack_32a;
  undefined2 uStack_320;
  undefined2 uStack_31e;
  undefined2 uStack_31c;
  undefined2 uStack_31a;
  undefined2 uStack_310;
  undefined2 uStack_30e;
  undefined2 uStack_30c;
  undefined2 uStack_30a;
  undefined2 uStack_300;
  undefined2 uStack_2fe;
  undefined2 uStack_2fc;
  undefined2 uStack_2fa;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  __m128i V5_hi_1;
  __m128i V5_lo_1;
  __m128i V3_hi_1;
  __m128i V3_lo_1;
  __m128i V2_hi_1;
  __m128i V2_lo_1;
  __m128i V1_hi_1;
  __m128i V1_lo_1;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_348 = (undefined2)uVar1;
  uStack_346 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_344 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_342 = (undefined2)((ulong)uVar1 >> 0x30);
  local_358 = (undefined2)uVar2;
  uStack_356 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_354 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_352 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[1];
  uVar2 = in_RSI[1];
  uStack_300 = (undefined2)uVar1;
  uStack_2fe = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_2fc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_2fa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_310 = (undefined2)uVar2;
  uStack_30e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_30c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_30a = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *in_RSI;
  uVar2 = *in_RDX;
  local_368 = (undefined2)uVar1;
  uStack_366 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_364 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_362 = (undefined2)((ulong)uVar1 >> 0x30);
  local_378 = (undefined2)uVar2;
  uStack_376 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_374 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_372 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RSI[1];
  uVar2 = in_RDX[1];
  uStack_320 = (undefined2)uVar1;
  uStack_31e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_31c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_31a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_330 = (undefined2)uVar2;
  uStack_32e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_32c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_32a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_358;
  auVar12._0_2_ = local_348;
  auVar12._4_2_ = uStack_346;
  auVar12._6_2_ = uStack_356;
  auVar12._10_2_ = uStack_354;
  auVar12._8_2_ = uStack_344;
  auVar12._12_2_ = uStack_342;
  auVar12._14_2_ = uStack_352;
  auVar11._8_8_ = 0xb577da09b577da09;
  auVar11._0_8_ = 0xb577da09b577da09;
  auVar17 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_310;
  auVar10._0_2_ = uStack_300;
  auVar10._4_2_ = uStack_2fe;
  auVar10._6_2_ = uStack_30e;
  auVar10._10_2_ = uStack_30c;
  auVar10._8_2_ = uStack_2fc;
  auVar10._12_2_ = uStack_2fa;
  auVar10._14_2_ = uStack_30a;
  auVar9._8_8_ = 0xb577da09b577da09;
  auVar9._0_8_ = 0xb577da09b577da09;
  auVar18 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_378;
  auVar8._0_2_ = local_368;
  auVar8._4_2_ = uStack_366;
  auVar8._6_2_ = uStack_376;
  auVar8._10_2_ = uStack_374;
  auVar8._8_2_ = uStack_364;
  auVar8._12_2_ = uStack_362;
  auVar8._14_2_ = uStack_372;
  auVar7._8_8_ = 0x7080000070800000;
  auVar7._0_8_ = 0x7080000070800000;
  auVar19 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_330;
  auVar6._0_2_ = uStack_320;
  auVar6._4_2_ = uStack_31e;
  auVar6._6_2_ = uStack_32e;
  auVar6._10_2_ = uStack_32c;
  auVar6._8_2_ = uStack_31c;
  auVar6._12_2_ = uStack_31a;
  auVar6._14_2_ = uStack_32a;
  auVar5._8_8_ = 0x7080000070800000;
  auVar5._0_8_ = 0x7080000070800000;
  auVar20 = pmaddwd(auVar6,auVar5);
  local_f8 = auVar17._0_4_;
  iStack_f4 = auVar17._4_4_;
  iStack_f0 = auVar17._8_4_;
  iStack_ec = auVar17._12_4_;
  local_108 = auVar19._0_4_;
  iStack_104 = auVar19._4_4_;
  iStack_100 = auVar19._8_4_;
  iStack_fc = auVar19._12_4_;
  local_118 = auVar18._0_4_;
  iStack_114 = auVar18._4_4_;
  iStack_110 = auVar18._8_4_;
  iStack_10c = auVar18._12_4_;
  local_128 = auVar20._0_4_;
  iStack_124 = auVar20._4_4_;
  iStack_120 = auVar20._8_4_;
  iStack_11c = auVar20._12_4_;
  auVar17 = ZEXT416(0x12);
  auVar18 = ZEXT416(0x12);
  auVar16._4_4_ = iStack_f4 + iStack_104 + 0x2020000 >> auVar17;
  auVar16._0_4_ = local_f8 + local_108 + 0x2020000 >> auVar17;
  auVar16._12_4_ = iStack_ec + iStack_fc + 0x2020000 >> auVar17;
  auVar16._8_4_ = iStack_f0 + iStack_100 + 0x2020000 >> auVar17;
  auVar15._4_4_ = iStack_114 + iStack_124 + 0x2020000 >> auVar18;
  auVar15._0_4_ = local_118 + local_128 + 0x2020000 >> auVar18;
  auVar15._12_4_ = iStack_10c + iStack_11c + 0x2020000 >> auVar18;
  auVar15._8_4_ = iStack_110 + iStack_120 + 0x2020000 >> auVar18;
  auVar17 = packssdw(auVar16,auVar15);
  *in_RCX = auVar17;
  auVar4._2_2_ = local_358;
  auVar4._0_2_ = local_348;
  auVar4._4_2_ = uStack_346;
  auVar4._6_2_ = uStack_356;
  auVar4._10_2_ = uStack_354;
  auVar4._8_2_ = uStack_344;
  auVar4._12_2_ = uStack_342;
  auVar4._14_2_ = uStack_352;
  auVar21._8_6_ = 0x708000007080;
  auVar21._0_8_ = 0x708000007080;
  auVar21._14_2_ = 0;
  auVar21 = pmaddwd(auVar4,auVar21);
  auVar3._2_2_ = uStack_310;
  auVar3._0_2_ = uStack_300;
  auVar3._4_2_ = uStack_2fe;
  auVar3._6_2_ = uStack_30e;
  auVar3._10_2_ = uStack_30c;
  auVar3._8_2_ = uStack_2fc;
  auVar3._12_2_ = uStack_2fa;
  auVar3._14_2_ = uStack_30a;
  auVar22._8_6_ = 0x708000007080;
  auVar22._0_8_ = 0x708000007080;
  auVar22._14_2_ = 0;
  auVar22 = pmaddwd(auVar3,auVar22);
  auVar20._2_2_ = local_378;
  auVar20._0_2_ = local_368;
  auVar20._4_2_ = uStack_366;
  auVar20._6_2_ = uStack_376;
  auVar20._10_2_ = uStack_374;
  auVar20._8_2_ = uStack_364;
  auVar20._12_2_ = uStack_362;
  auVar20._14_2_ = uStack_372;
  auVar19._8_8_ = 0xedb4a1ccedb4a1cc;
  auVar19._0_8_ = 0xedb4a1ccedb4a1cc;
  auVar19 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_330;
  auVar18._0_2_ = uStack_320;
  auVar18._4_2_ = uStack_31e;
  auVar18._6_2_ = uStack_32e;
  auVar18._10_2_ = uStack_32c;
  auVar18._8_2_ = uStack_31c;
  auVar18._12_2_ = uStack_31a;
  auVar18._14_2_ = uStack_32a;
  auVar17._8_8_ = 0xedb4a1ccedb4a1cc;
  auVar17._0_8_ = 0xedb4a1ccedb4a1cc;
  auVar17 = pmaddwd(auVar18,auVar17);
  local_178 = auVar21._0_4_;
  iStack_174 = auVar21._4_4_;
  iStack_170 = auVar21._8_4_;
  iStack_16c = auVar21._12_4_;
  local_188 = auVar19._0_4_;
  iStack_184 = auVar19._4_4_;
  iStack_180 = auVar19._8_4_;
  iStack_17c = auVar19._12_4_;
  local_198 = auVar22._0_4_;
  iStack_194 = auVar22._4_4_;
  iStack_190 = auVar22._8_4_;
  iStack_18c = auVar22._12_4_;
  local_1a8 = auVar17._0_4_;
  iStack_1a4 = auVar17._4_4_;
  iStack_1a0 = auVar17._8_4_;
  iStack_19c = auVar17._12_4_;
  auVar17 = ZEXT416(0x12);
  auVar18 = ZEXT416(0x12);
  auVar14._4_4_ = iStack_174 + iStack_184 + 0x2020000 >> auVar17;
  auVar14._0_4_ = local_178 + local_188 + 0x2020000 >> auVar17;
  auVar14._12_4_ = iStack_16c + iStack_17c + 0x2020000 >> auVar17;
  auVar14._8_4_ = iStack_170 + iStack_180 + 0x2020000 >> auVar17;
  auVar13._4_4_ = iStack_194 + iStack_1a4 + 0x2020000 >> auVar18;
  auVar13._0_4_ = local_198 + local_1a8 + 0x2020000 >> auVar18;
  auVar13._12_4_ = iStack_18c + iStack_19c + 0x2020000 >> auVar18;
  auVar13._8_4_ = iStack_190 + iStack_1a0 + 0x2020000 >> auVar18;
  auVar17 = packssdw(auVar14,auVar13);
  *in_R8 = auVar17;
  return;
}

Assistant:

static WEBP_INLINE void ConvertRGBToUV_SSE2(const __m128i* const R,
                                            const __m128i* const G,
                                            const __m128i* const B,
                                            __m128i* const U,
                                            __m128i* const V) {
  const __m128i kRG_u = MK_CST_16(-9719, -19081);
  const __m128i kGB_u = MK_CST_16(0, 28800);
  const __m128i kRG_v = MK_CST_16(28800, 0);
  const __m128i kGB_v = MK_CST_16(-24116, -4684);
  const __m128i kHALF_UV = _mm_set1_epi32(((128 << YUV_FIX) + YUV_HALF) << 2);

  const __m128i RG_lo = _mm_unpacklo_epi16(*R, *G);
  const __m128i RG_hi = _mm_unpackhi_epi16(*R, *G);
  const __m128i GB_lo = _mm_unpacklo_epi16(*G, *B);
  const __m128i GB_hi = _mm_unpackhi_epi16(*G, *B);
  TRANSFORM(RG_lo, RG_hi, GB_lo, GB_hi, kRG_u, kGB_u,
            kHALF_UV, YUV_FIX + 2, *U);
  TRANSFORM(RG_lo, RG_hi, GB_lo, GB_hi, kRG_v, kGB_v,
            kHALF_UV, YUV_FIX + 2, *V);
}